

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void pbrt::StatsReportPixelStart(Point2i *p)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 *in_RDI;
  char (*in_stack_00000030) [33];
  char *in_stack_00000038;
  int in_stack_00000044;
  char *in_stack_00000048;
  LogLevel in_stack_00000054;
  
  if ((pixelStatsEnabled & 1) != 0) {
    lVar1 = threadStatsState();
    if ((*(byte *)(lVar1 + 8) & 1) != 0) {
      LogFatal<char_const(&)[33]>
                (in_stack_00000054,in_stack_00000048,in_stack_00000044,in_stack_00000038,
                 in_stack_00000030);
    }
    lVar1 = threadStatsState();
    *(undefined1 *)(lVar1 + 8) = 1;
    puVar2 = (undefined8 *)threadStatsState();
    *puVar2 = *in_RDI;
    uVar3 = std::chrono::_V2::steady_clock::now();
    lVar1 = threadStatsState();
    *(undefined8 *)(lVar1 + 0x10) = uVar3;
  }
  return;
}

Assistant:

void StatsReportPixelStart(const Point2i &p) {
    if (!pixelStatsEnabled)
        return;
    CHECK(threadStatsState.active == false);
    threadStatsState.active = true;
    threadStatsState.p = p;
    threadStatsState.start = std::chrono::steady_clock::now();
}